

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

_Bool sysbvm_identityDictionary_find
                (sysbvm_tuple_t dictionary,sysbvm_tuple_t element,sysbvm_tuple_t *outValue)

{
  ulong uVar1;
  intptr_t iVar2;
  sysbvm_tuple_t sVar3;
  
  *outValue = 0;
  if ((((dictionary & 0xf) == 0 && dictionary != 0) &&
      (iVar2 = sysbvm_identityDictionary_scanFor(dictionary,element), -1 < iVar2)) &&
     (uVar1 = *(ulong *)(*(long *)(dictionary + 0x18) + 0x10 + iVar2 * 8), uVar1 != 0)) {
    if (((uVar1 & 0xf) == 0) && (0xf < *(uint *)(uVar1 + 0xc))) {
      sVar3 = *(sysbvm_tuple_t *)(uVar1 + 0x18);
    }
    else {
      sVar3 = 0;
    }
    *outValue = sVar3;
    return true;
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_identityDictionary_find(sysbvm_tuple_t dictionary, sysbvm_tuple_t element, sysbvm_tuple_t *outValue)
{
    *outValue = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return false;

    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, element);
    if(elementIndex < 0)
        return false;

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(!storage->elements[elementIndex])
        return false;

    *outValue = sysbvm_association_getValue(storage->elements[elementIndex]);
    return true;
}